

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_merge.hpp
# Opt level: O0

unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> * __thiscall
optimization::const_merge::Env::get_inst(Env *this,pair<int,_int> pair)

{
  reference pvVar1;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *in_RDI;
  size_type in_stack_ffffffffffffffe8;
  
  std::
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
        *)pair,(key_type *)this);
  pvVar1 = std::
           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ::at(in_RDI,in_stack_ffffffffffffffe8);
  return pvVar1;
}

Assistant:

std::unique_ptr<mir::inst::Inst>& get_inst(
      std::pair<mir::types::LabelId, int> pair) {
    return func.basic_blks.at(pair.first).inst.at(pair.second);
  }